

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_identities_derived(lysc_ctx *ctx,lysp_ident *idents_p,lysc_ident **idents)

{
  lysc_ident *plVar1;
  LY_ERR LVar2;
  ulong uVar3;
  ulong uVar4;
  char ***pppcVar5;
  ulong uVar6;
  
  uVar6 = 0;
  lysc_update_path(ctx,(lys_module *)0x0,"{identity}");
  while( true ) {
    plVar1 = *idents;
    if (plVar1 == (lysc_ident *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)&plVar1[-1].flags;
    }
    if (uVar3 <= uVar6) break;
    uVar3 = 0;
    pppcVar5 = &idents_p->bases;
    while( true ) {
      if (idents_p == (lysp_ident *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)&idents_p[-1].flags;
      }
      if ((uVar4 <= uVar3) || (((lysp_ident *)(pppcVar5 + -2))->name == plVar1[uVar6].name)) break;
      uVar3 = uVar3 + 1;
      pppcVar5 = pppcVar5 + 7;
    }
    if (idents_p == (lysp_ident *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ulong *)&idents_p[-1].flags;
    }
    if ((uVar4 != uVar3) && (*pppcVar5 != (char **)0x0)) {
      lysc_update_path(ctx,(lys_module *)0x0,plVar1[uVar6].name);
      LVar2 = lys_compile_identity_bases
                        (ctx,ctx->pmod,*pppcVar5,*idents + uVar6,(lysc_ident ***)0x0);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    }
    uVar6 = uVar6 + 1;
  }
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_compile_identities_derived(struct lysc_ctx *ctx, struct lysp_ident *idents_p, struct lysc_ident **idents)
{
    LY_ARRAY_COUNT_TYPE u, v;

    lysc_update_path(ctx, NULL, "{identity}");

    for (u = 0; u < LY_ARRAY_COUNT(*idents); ++u) {
        /* find matching parsed identity */
        for (v = 0; v < LY_ARRAY_COUNT(idents_p); ++v) {
            if (idents_p[v].name == (*idents)[u].name) {
                break;
            }
        }

        if ((v == LY_ARRAY_COUNT(idents_p)) || !idents_p[v].bases) {
            /* identity not found (it may be from a submodule) or identity without bases */
            continue;
        }

        lysc_update_path(ctx, NULL, (*idents)[u].name);
        LY_CHECK_RET(lys_compile_identity_bases(ctx, ctx->pmod, idents_p[v].bases, &(*idents)[u], NULL));
        lysc_update_path(ctx, NULL, NULL);
    }

    lysc_update_path(ctx, NULL, NULL);
    return LY_SUCCESS;
}